

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader.c++
# Opt level: O0

void __thiscall capnp::SchemaLoader::~SchemaLoader(SchemaLoader *this)

{
  SchemaLoader *this_local;
  
  kj::MutexGuarded<kj::Own<capnp::SchemaLoader::Impl,_std::nullptr_t>_>::~MutexGuarded(&this->impl);
  return;
}

Assistant:

SchemaLoader::~SchemaLoader() noexcept(false) {}